

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_added_data(Terminal *term,_Bool called_from_term_data)

{
  if (term->in_term_out == false) {
    term->in_term_out = true;
    term->seen_disp_event = true;
    if (term->window_update_pending == false) {
      term->window_update_pending = true;
      queue_toplevel_callback(term_update_callback,term);
    }
    term->cblinker = true;
    term->cblink_pending = false;
    term_schedule_cblink(term);
    term_out(term,called_from_term_data);
    term->in_term_out = false;
  }
  return;
}

Assistant:

static void term_added_data(Terminal *term, bool called_from_term_data)
{
    if (!term->in_term_out) {
        term->in_term_out = true;
        term_reset_cblink(term);
        term_out(term, called_from_term_data);
        term->in_term_out = false;
    }
}